

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

NodeRef * __thiscall c4::yml::Tree::ref(Tree *this,size_t id)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  ulong in_RDX;
  long in_RSI;
  NodeRef *in_RDI;
  char msg [53];
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  Location *in_stack_ffffffffffffff60;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined1 local_48 [72];
  
  if ((in_RDX == 0xffffffffffffffff) || (*(ulong *)(in_RSI + 0x10) <= in_RDX)) {
    memcpy(local_48,"check failed: (id != NONE && id >= 0 && id < m_size)",0x35);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RSI + 0x58);
    Location::Location(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    (*pcVar1)(local_48,0x35,*(undefined8 *)(in_RSI + 0x40));
    in_stack_ffffffffffffff40 = uStack_68;
    in_stack_ffffffffffffff44 = uStack_64;
    in_stack_ffffffffffffff48 = local_60;
    in_stack_ffffffffffffff4c = uStack_5c;
    in_stack_ffffffffffffff50 = uStack_58;
    in_stack_ffffffffffffff54 = uStack_54;
  }
  NodeRef::NodeRef((NodeRef *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (Tree *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  return in_RDI;
}

Assistant:

NodeRef Tree::ref(size_t id)
{
    _RYML_CB_ASSERT(m_callbacks, id != NONE && id >= 0 && id < m_size);
    return NodeRef(this, id);
}